

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t _elemsize;
  void *pvVar3;
  void *pvVar4;
  int k_1;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  size_type __n;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int k;
  ulong uVar18;
  int q;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  float fVar23;
  int local_190;
  long local_180;
  Mat m;
  Mat top_blob_bordered;
  long local_f8;
  long local_e0;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  
  iVar15 = bottom_blob->c;
  if (iVar15 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar10 = (ulong)uVar2;
  _elemsize = bottom_blob->elemsize;
  iVar19 = (this->kernel_w + -1) * this->dilation_w + (uVar1 - 1) * this->stride_w + 1;
  iVar21 = (this->kernel_h + -1) * this->dilation_h + (uVar2 - 1) * this->stride_h + 1;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount = (int *)0x0;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    Mat::operator=(&top_blob_bordered,top_blob);
    Mat::create(&top_blob_bordered,iVar19,iVar21,this->num_output,_elemsize,opt->blob_allocator);
  }
  else {
    Mat::create(&top_blob_bordered,iVar19,iVar21,this->num_output,_elemsize,opt->workspace_allocator
               );
  }
  iVar21 = -100;
  if ((top_blob_bordered.data == (void *)0x0) ||
     ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0)) goto LAB_001252ee;
  __n = (long)this->kernel_h * (long)this->kernel_w;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
  iVar21 = this->dilation_h;
  iVar12 = this->kernel_w;
  iVar8 = this->dilation_w * iVar12;
  iVar11 = 0;
  lVar14 = 0;
  for (iVar9 = 0; iVar9 < this->kernel_h; iVar9 = iVar9 + 1) {
    for (lVar16 = 0; (int)lVar16 < iVar12; lVar16 = lVar16 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar14 + lVar16] = iVar11;
      iVar11 = iVar11 + this->dilation_w;
      iVar12 = this->kernel_w;
    }
    iVar11 = iVar11 + (iVar19 * iVar21 - iVar8);
    lVar14 = (int)lVar14 + lVar16;
  }
  iVar19 = this->group;
  iVar21 = (int)__n;
  if (iVar19 == this->num_output && iVar15 == iVar19) {
    uVar20 = 0;
    if (0 < iVar21) {
      uVar20 = __n & 0xffffffff;
    }
    uVar13 = 0;
    if (0 < (int)uVar1) {
      uVar13 = (ulong)uVar1;
    }
    local_180 = 0;
    if ((int)uVar2 < 1) {
      uVar10 = 0;
    }
    for (lVar14 = 0; lVar14 < iVar15; lVar14 = lVar14 + 1) {
      Mat::channel(&m,bottom_blob,(int)lVar14);
      pvVar4 = m.data;
      Mat::~Mat(&m);
      pvVar3 = (this->weight_data).data;
      m.data = (void *)(top_blob_bordered.cstep * lVar14 * top_blob_bordered.elemsize +
                       (long)top_blob_bordered.data);
      m.refcount = (int *)0x0;
      m.elemsize = top_blob_bordered.elemsize;
      m.allocator = top_blob_bordered.allocator;
      m.dims = 2;
      m.w = top_blob_bordered.w;
      m.h = top_blob_bordered.h;
      m.c = 1;
      m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
      if (this->bias_term == 0) {
        fVar23 = 0.0;
      }
      else {
        fVar23 = *(float *)((long)(this->bias_data).data + lVar14 * 4);
      }
      Mat::fill(&m,fVar23);
      for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
        iVar15 = this->stride_h;
        iVar19 = this->stride_w;
        for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
          lVar16 = uVar17 * (long)iVar19 * 4 + (long)m.w * (long)(int)uVar6 * (long)iVar15 * 4;
          for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
            *(float *)((long)m.data +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar18] * 4 + lVar16) =
                 *(float *)((long)pvVar3 + uVar18 * 4 + local_180) *
                 *(float *)((long)pvVar4 + uVar17 * 4 + uVar6 * (long)(int)uVar1 * 4) +
                 *(float *)((long)m.data +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar18] * 4 + lVar16);
          }
        }
      }
      Mat::~Mat(&m);
      iVar15 = this->group;
      local_180 = local_180 + __n * 4;
    }
  }
  else {
    iVar15 = iVar15 / iVar19;
    uVar5 = this->num_output / iVar19;
    uVar20 = 0;
    if (0 < iVar21) {
      uVar20 = __n & 0xffffffff;
    }
    iVar12 = 0;
    if (0 < iVar15) {
      iVar12 = iVar15;
    }
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = 0;
    }
    local_e0 = 0;
    if ((int)uVar2 < 1) {
      uVar10 = 0;
    }
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    for (lVar14 = 0; lVar14 < iVar19; lVar14 = lVar14 + 1) {
      local_f8 = (long)(this->weight_data).data + local_e0;
      for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
        lVar16 = lVar14 * (int)uVar5 + uVar17;
        m.data = (void *)(top_blob_bordered.cstep * lVar16 * top_blob_bordered.elemsize +
                         (long)top_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.elemsize = top_blob_bordered.elemsize;
        m.allocator = top_blob_bordered.allocator;
        m.dims = 2;
        m.w = top_blob_bordered.w;
        m.h = top_blob_bordered.h;
        m.c = 1;
        m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
        if (this->bias_term == 0) {
          fVar23 = 0.0;
        }
        else {
          fVar23 = *(float *)((long)(this->bias_data).data + lVar16 * 4);
        }
        Mat::fill(&m,fVar23);
        for (iVar19 = 0; local_190 = (int)uVar10, iVar19 != local_190; iVar19 = iVar19 + 1) {
          for (uVar18 = 0; pvVar3 = m.data, uVar18 != uVar13; uVar18 = uVar18 + 1) {
            lVar16 = (long)(int)uVar18 * (long)this->stride_w * 4 +
                     (long)m.w * (long)this->stride_h * (long)iVar19 * 4;
            lVar22 = local_f8;
            for (iVar8 = 0; iVar8 != iVar12; iVar8 = iVar8 + 1) {
              Mat::channel(&m_1,bottom_blob,iVar8 + iVar15 * (int)lVar14);
              fVar23 = *(float *)((long)m_1.data + uVar18 * 4 + (long)m_1.w * (long)iVar19 * 4);
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar3 +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar7] * 4 + lVar16) =
                     *(float *)(lVar22 + uVar7 * 4) * fVar23 +
                     *(float *)((long)pvVar3 +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar7] * 4 + lVar16);
              }
              Mat::~Mat(&m_1);
              lVar22 = lVar22 + __n * 4;
            }
          }
        }
        Mat::~Mat(&m);
        local_f8 = local_f8 + (long)(iVar15 * iVar21) * 4;
      }
      iVar19 = this->group;
      local_e0 = local_e0 + (long)(int)(iVar15 * iVar21 * uVar5) * 4;
    }
  }
  iVar15 = this->pad_w;
  iVar19 = this->pad_h;
  if (iVar19 < 1 && iVar15 < 1) {
    Mat::operator=(top_blob,&top_blob_bordered);
LAB_001252df:
    iVar21 = 0;
  }
  else {
    copy_cut_border(&top_blob_bordered,top_blob,iVar19,iVar19,iVar15,iVar15,opt->blob_allocator,
                    opt->num_threads);
    iVar21 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_001252df;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_001252ee:
  Mat::~Mat(&top_blob_bordered);
  return iVar21;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}